

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unparser.cc
# Opt level: O3

Status __thiscall
google::protobuf::json_internal::anon_unknown_4::
WriteMessage<google::protobuf::json_internal::UnparseProto2Descriptor>
          (anon_unknown_4 *this,JsonWriter *writer,
          Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *msg,
          Desc<google::protobuf::json_internal::UnparseProto2Descriptor> *desc,bool is_top_level)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *pMVar4;
  anon_unknown_4 *paVar5;
  bool bVar6;
  bool bVar7;
  MessageType MVar8;
  Field f;
  long lVar9;
  ulong uVar10;
  Status SVar11;
  Field pFVar12;
  string *psVar13;
  uintptr_t extraout_RAX;
  Descriptor *type;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 aVar14;
  uintptr_t extraout_RAX_00;
  uintptr_t extraout_RAX_01;
  uintptr_t uVar15;
  uintptr_t extraout_RAX_02;
  MessageLite *pMVar16;
  uintptr_t extraout_RAX_03;
  uintptr_t extraout_RAX_04;
  uint uVar17;
  byte bVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  size_t sVar22;
  char *extraout_RDX;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 aVar23;
  char *pcVar24;
  undefined8 uVar25;
  int iVar26;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 *this_00;
  int iVar27;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 aVar28;
  string_view name;
  string_view name_00;
  string_view data;
  string_view name_01;
  anon_class_16_2_3789d670 body;
  anon_class_16_2_3789d670 body_00;
  Metadata MVar29;
  StatusOr<int> nanos;
  bool first;
  StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> type_url;
  DynamicMessageFactory factory;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 local_170;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_168;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_160;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_150;
  uint local_148;
  undefined4 uStack_144;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 local_140;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 local_130;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 aStack_128;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 local_120;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 local_100;
  char *local_f8;
  pointer pcStack_f0;
  string *local_e8;
  Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *local_e0;
  Field local_d8;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 local_d0;
  anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 local_c8;
  anon_union_8_1_1246618d_for_StatusOrData<int>_1 aStack_c0;
  code *local_b8;
  ulong local_b0;
  code *local_a8;
  ulong local_a0;
  code *local_98;
  ulong local_90;
  code *local_88;
  ulong local_80;
  code *local_78;
  long local_70;
  code *local_68;
  ulong local_60;
  code *local_58;
  anon_unknown_4 *local_50;
  size_t local_48;
  Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> local_40;
  
  name._M_str = (char *)msg;
  name._M_len = (size_t)desc->all_names_[1]._M_dataplus._M_p;
  MVar8 = ClassifyMessage((json_internal *)desc->all_names_[1]._M_string_length,name);
  switch(MVar8) {
  case kAny:
    pFVar12 = Proto2Descriptor::MustHaveField(desc,1);
    f = Proto2Descriptor::MustHaveField(desc,2);
    sVar22 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
    local_d8 = f;
    psVar13 = (string *)UnparseProto2Descriptor::GetSize(f,msg);
    if (psVar13 != (string *)0x0 || sVar22 != 0) {
      if (sVar22 == 0) {
        pcVar24 = "broken Any: missing type URL";
        uVar25 = 0x1c;
LAB_002caa62:
        uVar15 = absl::lts_20240722::InvalidArgumentError(this,uVar25,pcVar24);
        return (Status)uVar15;
      }
      if ((psVar13 == (string *)0x0) && ((writer->options_).allow_legacy_syntax == false)) {
        pcVar24 = "broken Any: missing value";
        uVar25 = 0x19;
        goto LAB_002caa62;
      }
      local_e8 = psVar13;
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"{",1);
      writer->indent_ = writer->indent_ + 1;
      MVar29 = Message::GetMetadata(msg);
      local_e0 = msg;
      psVar13 = Reflection::GetStringReference(MVar29.reflection,msg,pFVar12,&writer->scratch_buf_);
      pcStack_f0 = (psVar13->_M_dataplus)._M_p;
      local_f8 = (char *)psVar13->_M_string_length;
      local_100.data_ = 1;
      *(undefined8 *)this = 1;
      JsonWriter::NewLine(writer);
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"\"@type\":",8);
      if ((writer->options_).add_whitespace == true) {
        io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_," ",1);
      }
      if (local_100.data_ != 1) goto LAB_002cae29;
      local_40.value.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
      super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
      _M_head_impl._M_len = (size_t)local_f8;
      local_40.value.super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>_>.
      super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
      _M_head_impl._M_str = pcStack_f0;
      JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>(writer,&local_40);
      if (local_100.data_ == 1) {
        local_150 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)&local_140;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_150,pcStack_f0,pcStack_f0 + (long)local_f8);
        pMVar4 = local_e0;
        lVar9 = std::__cxx11::string::rfind((char)&local_150,0x2f);
        uVar10 = lVar9 + 1;
        if (uVar10 < 2) {
          local_d0.data_ = 0x3c;
          local_c8 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)0x3d7f02;
          local_130.data_._4_4_ = uStack_144;
          local_130.data_._0_4_ = local_148;
          aStack_128 = local_150;
          absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&local_170,(AlphaNum *)&local_d0);
          absl::lts_20240722::InvalidArgumentError(this,local_168,local_170.data_);
          if ((anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)local_170.data_ != &local_160) {
LAB_002caadb:
            operator_delete((void *)local_170,(long)local_160 + 1);
          }
        }
        else {
          name_00._M_len = CONCAT44(uStack_144,local_148) - uVar10;
          if (CONCAT44(uStack_144,local_148) < uVar10) {
            std::__throw_out_of_range_fmt
                      ("%s: __pos (which is %zu) > __size (which is %zu)",
                       "basic_string_view::substr",uVar10);
          }
          name_00._M_str = (char *)(uVar10 + (long)local_150);
          type = DescriptorPool::FindMessageTypeByName(desc->file_->pool_,name_00);
          if (type == (Descriptor *)0x0) {
            aStack_128 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)
                         absl::lts_20240722::str_format_internal::FormatArgImpl::
                         Dispatch<std::__cxx11::string>;
            local_130.data_ = (long)&local_150;
            absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                      (&local_d0,"could not find @type \'%s\'",0x19,&local_130,1);
            absl::lts_20240722::InvalidArgumentError(this,local_c8.data_,local_d0.data_);
            local_160 = aStack_c0;
            local_170 = local_d0;
            if ((anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)local_d0.data_ != &aStack_c0)
            goto LAB_002caadb;
          }
          else {
            if (local_e8 == (string *)0x0) {
              aVar23 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0;
              aVar14.data_ = 0;
            }
            else {
              MVar29 = Message::GetMetadata(pMVar4);
              psVar13 = Reflection::GetStringReference
                                  (MVar29.reflection,pMVar4,local_d8,&writer->scratch_buf_);
              aVar23 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)(psVar13->_M_dataplus)._M_p;
              aVar14 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)psVar13->_M_string_length;
              local_d0.data_ = 1;
              *(undefined8 *)this = 1;
              local_c8 = aVar14;
              aStack_c0 = aVar23;
              absl::lts_20240722::internal_statusor::
              StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                        ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                         &local_d0);
            }
            DynamicMessageFactory::DynamicMessageFactory((DynamicMessageFactory *)&local_d0);
            pMVar16 = &DynamicMessageFactory::GetPrototype((DynamicMessageFactory *)&local_d0,type)
                       ->super_MessageLite;
            pMVar16 = MessageLite::New(pMVar16,(Arena *)0x0);
            data._M_str = (char *)aVar23;
            data._M_len = aVar14.data_;
            MessageLite::ParsePartialFromString(pMVar16,data);
            local_130.data_ = local_130.data_ & 0xffffffffffffff00;
            name_01._M_str = extraout_RDX;
            name_01._M_len = (size_t)type->all_names_[1]._M_dataplus._M_p;
            MVar8 = ClassifyMessage((json_internal *)type->all_names_[1]._M_string_length,name_01);
            if (MVar8 == kNotWellKnown) {
              WriteFields<google::protobuf::json_internal::UnparseProto2Descriptor>
                        (this,writer,
                         (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)pMVar16,
                         type,(bool *)&local_130);
              if (*(long *)this == 1) {
                writer->indent_ = writer->indent_ + -1;
                if ((local_130.data_ & 1U) == 0) goto LAB_002cac75;
                goto LAB_002cac7d;
              }
            }
            else {
              io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,",",1);
              JsonWriter::NewLine(writer);
              io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"\"value\":",8);
              if ((writer->options_).add_whitespace == true) {
                io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_," ",1);
              }
              WriteMessage<google::protobuf::json_internal::UnparseProto2Descriptor>
                        (this,writer,
                         (Msg<google::protobuf::json_internal::UnparseProto2Descriptor> *)pMVar16,
                         type,false);
              if (*(long *)this == 1) {
                writer->indent_ = writer->indent_ + -1;
LAB_002cac75:
                JsonWriter::NewLine(writer);
LAB_002cac7d:
                io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"}",1);
                *(undefined8 *)this = 1;
              }
            }
            (*pMVar16->_vptr_MessageLite[1])(pMVar16);
            DynamicMessageFactory::~DynamicMessageFactory((DynamicMessageFactory *)&local_d0);
          }
        }
        if (local_150 != (anon_union_8_1_1246618d_for_StatusOrData<int>_1)&local_140) {
          operator_delete((void *)local_150,local_140.data_ + 1);
        }
        this_00 = &local_100;
        goto LAB_002caccf;
      }
LAB_002cae33:
      absl::lts_20240722::internal_statusor::Helper::Crash((Status *)&local_100);
LAB_002cae3d:
      absl::lts_20240722::internal_statusor::Helper::Crash((Status *)&local_d0);
LAB_002cae4a:
      pcVar24 = 
      "google.protobuf.Value cannot encode double values for nan, because it would be parsed as a string"
      ;
      uVar25 = 0x61;
LAB_002ca319:
      absl::lts_20240722::InvalidArgumentError(this,uVar25,pcVar24);
LAB_002caa17:
      absl::lts_20240722::internal_statusor::StatusOrData<double>::~StatusOrData
                ((StatusOrData<double> *)&local_d0);
      return (Status)extraout_RAX_00;
    }
    pcVar24 = "{}";
    sVar22 = 2;
    break;
  case kWrapper:
    pFVar12 = Proto2Descriptor::MustHaveField(desc,1);
    sVar22 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
    if (sVar22 != 0) {
      SVar11 = (anonymous_namespace)::
               WriteSingular<google::protobuf::json_internal::UnparseProto2Descriptor,google::protobuf::Message_const&>
                         ((_anonymous_namespace_ *)this,writer,pFVar12,msg);
      return (Status)SVar11.rep_;
    }
    SVar11 = WriteSingular<google::protobuf::json_internal::UnparseProto2Descriptor>
                       (this,writer,pFVar12);
    return (Status)SVar11.rep_;
  case kStruct:
    pFVar12 = Proto2Descriptor::MustHaveField(desc,1);
    SVar11 = WriteMap<google::protobuf::json_internal::UnparseProto2Descriptor>
                       (this,writer,msg,pFVar12);
    return (Status)SVar11.rep_;
  case kList:
    pFVar12 = Proto2Descriptor::MustHaveField(desc,1);
    SVar11 = WriteRepeated<google::protobuf::json_internal::UnparseProto2Descriptor>
                       (this,writer,msg,pFVar12);
    return (Status)SVar11.rep_;
  case kValue:
    pFVar12 = Proto2Descriptor::MustHaveField(desc,1);
    sVar22 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
    if (sVar22 == 0) {
      pFVar12 = Proto2Descriptor::MustHaveField(desc,2);
      sVar22 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
      if (sVar22 == 0) {
        pFVar12 = Proto2Descriptor::MustHaveField(desc,3);
        sVar22 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
        if (sVar22 == 0) {
          pFVar12 = Proto2Descriptor::MustHaveField(desc,4);
          sVar22 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
          if (sVar22 != 0) {
            MVar29 = Message::GetMetadata(msg);
            bVar7 = Reflection::GetBool(MVar29.reflection,msg,pFVar12);
            local_c8.data_._0_1_ = bVar7;
            local_d0.data_ = 1;
            *(undefined8 *)this = 1;
            absl::lts_20240722::Status::~Status((Status *)this);
            pcVar24 = "false";
            if (bVar7) {
              pcVar24 = "true";
            }
            io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                      (&writer->sink_,pcVar24,(ulong)bVar7 ^ 5);
            *(undefined8 *)this = 1;
            absl::lts_20240722::internal_statusor::StatusOrData<bool>::~StatusOrData
                      ((StatusOrData<bool> *)&local_d0);
            return (Status)extraout_RAX_02;
          }
          pFVar12 = Proto2Descriptor::MustHaveField(desc,5);
          sVar22 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
          if (sVar22 != 0) {
            MVar29 = Message::GetMetadata(msg);
            local_c8 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)
                       Reflection::GetMessage(MVar29.reflection,msg,pFVar12,(MessageFactory *)0x0);
            local_d0.data_ = 1;
            *(undefined8 *)this = 1;
            absl::lts_20240722::Status::~Status((Status *)this);
            body.x = (StatusOr<const_google::protobuf::Message_*> *)writer;
            body.writer = (JsonWriter *)pFVar12;
            Proto2Descriptor::
            WithFieldType<google::protobuf::json_internal::(anonymous_namespace)::WriteValue<google::protobuf::json_internal::UnparseProto2Descriptor>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto2Descriptor::Msg_const&,google::protobuf::json_internal::UnparseProto2Descriptor::Desc_const&,bool)::_lambda(google::protobuf::Descriptor_const&)_1_>
                      ((Field)this,body);
LAB_002cadba:
            absl::lts_20240722::internal_statusor::StatusOrData<const_google::protobuf::Message_*>::
            ~StatusOrData((StatusOrData<const_google::protobuf::Message_*> *)&local_d0);
            return (Status)extraout_RAX_04;
          }
          pFVar12 = Proto2Descriptor::MustHaveField(desc,6);
          sVar22 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
          if (sVar22 != 0) {
            MVar29 = Message::GetMetadata(msg);
            local_c8 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)
                       Reflection::GetMessage(MVar29.reflection,msg,pFVar12,(MessageFactory *)0x0);
            local_d0.data_ = 1;
            *(undefined8 *)this = 1;
            absl::lts_20240722::Status::~Status((Status *)this);
            body_00.x = (StatusOr<const_google::protobuf::Message_*> *)writer;
            body_00.writer = (JsonWriter *)pFVar12;
            Proto2Descriptor::
            WithFieldType<google::protobuf::json_internal::(anonymous_namespace)::WriteValue<google::protobuf::json_internal::UnparseProto2Descriptor>(google::protobuf::json_internal::JsonWriter&,google::protobuf::json_internal::UnparseProto2Descriptor::Msg_const&,google::protobuf::json_internal::UnparseProto2Descriptor::Desc_const&,bool)::_lambda(google::protobuf::Descriptor_const&)_2_>
                      ((Field)this,body_00);
            goto LAB_002cadba;
          }
          uVar15 = 0;
          if (!is_top_level) {
            absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_d0,
                       "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/json/internal/unparser.cc"
                       ,0x22b,0xc,"is_top_level");
            absl::lts_20240722::log_internal::LogMessage::
            CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
                      (&local_d0,0x81,
                       "empty, non-top-level Value must be handled one layer up, since it prints an empty string; reaching this statement is always a bug"
                      );
            absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_d0);
          }
          goto LAB_002ca283;
        }
        UnparseProto2Descriptor::GetString
                  ((StatusOr<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_d0,
                   pFVar12,&writer->scratch_buf_,msg);
        *(anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 *)this = local_d0;
        aVar14 = local_d0;
        if ((local_d0.data_ & 1U) == 0) {
          LOCK();
          *(int *)local_d0 = *(int *)local_d0 + 1;
          UNLOCK();
          aVar14 = *(anon_union_8_2_a3c22f61_for_StatusOrData<long>_3 *)this;
        }
        if ((anon_union_8_1_1246618d_for_StatusOrData<int>_1)aVar14.data_ !=
            (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
LAB_002ca1a1:
          this_00 = &local_d0;
LAB_002caccf:
          absl::lts_20240722::internal_statusor::
          StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                    ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)this_00
                    );
          return (Status)extraout_RAX_03;
        }
        absl::lts_20240722::Status::~Status((Status *)this);
        if ((anon_union_8_1_1246618d_for_StatusOrData<int>_1)local_d0.data_ ==
            (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
          local_130 = local_c8;
          aStack_128 = aStack_c0;
          JsonWriter::Write<std::basic_string_view<char,std::char_traits<char>>>
                    (writer,(Quoted<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                            &local_130);
          *(undefined8 *)this = 1;
          goto LAB_002ca1a1;
        }
        goto LAB_002cae3d;
      }
      MVar29 = Message::GetMetadata(msg);
      local_c8 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)
                 Reflection::GetDouble(MVar29.reflection,msg,pFVar12);
      local_d0.data_ = 1;
      *(undefined8 *)this = 1;
      if (NAN((double)local_c8)) goto LAB_002cae4a;
      if ((local_c8.data_ & 0x7fffffffffffffffU) != 0x7ff0000000000000) {
        JsonWriter::Write(writer,(double)local_c8);
        *(undefined8 *)this = 1;
        goto LAB_002caa17;
      }
      pcVar24 = 
      "google.protobuf.Value cannot encode double values for infinity, because it would be parsed as a string"
      ;
      uVar25 = 0x66;
      goto LAB_002ca319;
    }
    pcVar24 = "null";
    sVar22 = 4;
    break;
  default:
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,"{",1);
    writer->indent_ = writer->indent_ + 1;
    local_d0.data_._0_1_ = 1;
    SVar11 = WriteFields<google::protobuf::json_internal::UnparseProto2Descriptor>
                       (this,writer,msg,desc,(bool *)&local_d0);
    if (*(long *)this != 1) {
      return (Status)SVar11.rep_;
    }
    writer->indent_ = writer->indent_ + -1;
    if (local_d0.data_._0_1_ == '\0') {
      JsonWriter::NewLine(writer);
    }
    pcVar24 = "}";
    sVar22 = 1;
    break;
  case kTimestamp:
    pFVar12 = Proto2Descriptor::MustHaveField(desc,1);
    sVar22 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
    if (sVar22 != 0) {
      MVar29 = Message::GetMetadata(msg);
      local_168 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)
                  Reflection::GetInt64(MVar29.reflection,msg,pFVar12);
      local_170.data_ = 1;
      *(undefined8 *)this = 1;
      if ((long)local_168 < -0xe7791f700) {
        pcVar24 = "minimum acceptable time value is 0001-01-01T00:00:00Z";
      }
      else {
        if ((long)local_168 < 0x3afff44180) goto LAB_002ca34e;
        pcVar24 = "maximum acceptable time value is 9999-12-31T23:59:59Z";
      }
      absl::lts_20240722::InvalidArgumentError(this,0x35,pcVar24);
      goto LAB_002caa47;
    }
    *(undefined8 *)this = 1;
    local_168 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0;
LAB_002ca34e:
    local_170.data_ = 1;
    local_168 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)((long)local_168 + 0xe7791f700);
    pFVar12 = Proto2Descriptor::MustHaveField(desc,2);
    sVar22 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
    if (sVar22 == 0) {
      local_148 = 0;
    }
    else {
      MVar29 = Message::GetMetadata(msg);
      local_148 = Reflection::GetInt32(MVar29.reflection,msg,pFVar12);
    }
    local_150 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1;
    *(undefined8 *)this = 1;
    if ((anon_union_8_1_1246618d_for_StatusOrData<int>_1)local_170.data_ !=
        (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) {
      absl::lts_20240722::internal_statusor::Helper::Crash((Status *)&local_170);
LAB_002cae1f:
      absl::lts_20240722::internal_statusor::Helper::Crash((Status *)&local_170);
LAB_002cae29:
      absl::lts_20240722::internal_statusor::Helper::Crash((Status *)&local_100);
      goto LAB_002cae33;
    }
    iVar21 = (int)(SUB168(SEXT816((long)local_168) * SEXT816(0x1845c8a0ce512957),8) >> 0xd);
    iVar26 = SUB164(SEXT816((long)local_168) * SEXT816(0x1845c8a0ce512957),0xc) >> 0x1f;
    iVar3 = ((iVar21 - iVar26) * 4 + 0x6d40ac) / 0x23ab1;
    iVar19 = iVar3 * 0x23ab1;
    iVar20 = iVar19 + 3;
    iVar19 = iVar19 + 6;
    if (-1 < iVar20) {
      iVar19 = iVar20;
    }
    iVar26 = ((iVar21 - iVar26) + 0x1b502b) - (iVar19 >> 2);
    iVar20 = iVar26 * 4000;
    iVar20 = iVar20 + (int)((ulong)((long)(iVar20 + 4000) * -0x48441d23) >> 0x20) + 4000;
    iVar21 = (iVar20 >> 0x14) - (iVar20 >> 0x1f);
    iVar19 = iVar21 * 0x5b5;
    iVar20 = iVar19 + 3;
    if (-1 < iVar19) {
      iVar20 = iVar19;
    }
    iVar19 = (iVar26 - (iVar20 >> 2)) + 0x1f;
    iVar20 = iVar19 * 0x50;
    iVar26 = iVar20 / 0x98f;
    iVar27 = (int)((ulong)((long)(iVar26 * 0x98f) * -0x66666667) >> 0x20);
    local_b0 = (ulong)(uint)((iVar19 - (iVar27 >> 0x1f)) + (iVar27 >> 5));
    iVar20 = iVar20 / 0x6925;
    aStack_c0.status_.rep_._0_4_ = iVar26 + iVar20 * -0xc + 2;
    local_d0.data_._0_4_ = (iVar3 * 100 + iVar21 + iVar20) - 0x1324;
    local_90 = ((long)local_168 / 0x3c) % 0x3c;
    lVar9 = (long)local_168 / 0xe10;
    local_a0 = lVar9 + (((ulong)(lVar9 / 6 + (lVar9 >> 0x3f)) >> 2) - (lVar9 >> 0x3f)) * -0x18;
    if (local_148 == 0) {
      local_d0.data_._4_4_ = 0;
      local_c8.data_ = (long)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
      aStack_c0.status_.rep_._4_4_ = 0;
      local_b8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
      local_a8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
      local_a0 = local_a0 & 0xffffffff;
      local_98 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
      local_90 = local_90 & 0xffffffff;
      local_88 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
      local_80 = (long)local_168 % 0x3c & 0xffffffff;
      local_78 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
      absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                (&local_130,"\"%04d-%02d-%02dT%02d:%02d:%02dZ\"",0x20,&local_d0,6);
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                (&writer->sink_,(char *)local_130,(size_t)aStack_128);
    }
    else {
      uVar2 = -local_148;
      if (0 < (int)local_148) {
        uVar2 = local_148;
      }
      local_70 = 9;
      uVar17 = uVar2 * 0x26e978d5 >> 3 | uVar2 * -0x60000000;
      while (uVar17 < 0x418938) {
        local_70 = local_70 + -3;
        uVar17 = (uVar2 / 1000) * 0x26e978d5 >> 3 | (uVar2 / 1000) * -0x60000000;
        uVar2 = uVar2 / 1000;
      }
      local_d0.data_._4_4_ = 0;
      local_c8.data_ = (long)absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
      aStack_c0.status_.rep_._4_4_ = 0;
      local_b8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
      local_a8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
      local_a0 = local_a0 & 0xffffffff;
      local_98 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
      local_90 = local_90 & 0xffffffff;
      local_88 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
      local_80 = (long)local_168 % 0x3c & 0xffffffff;
      local_78 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<int>;
      local_68 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_long>;
      local_60 = (ulong)uVar2;
      local_58 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_int>;
      absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                (&local_130,"\"%04d-%02d-%02dT%02d:%02d:%02d.%.*dZ\"",0x25,&local_d0,8);
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                (&writer->sink_,(char *)local_130,(size_t)aStack_128);
    }
LAB_002ca8bc:
    aVar14 = local_130;
    if ((anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)local_130.data_ != &local_120) {
LAB_002ca8cf:
      operator_delete((void *)aVar14,(long)local_120 + 1);
    }
LAB_002ca8d7:
    *(undefined8 *)this = 1;
    goto LAB_002caa3d;
  case kDuration:
    pFVar12 = Proto2Descriptor::MustHaveField(desc,1);
    sVar22 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
    if (sVar22 == 0) {
      local_168 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0;
      *(undefined8 *)this = 1;
    }
    else {
      MVar29 = Message::GetMetadata(msg);
      local_168 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)
                  Reflection::GetInt64(MVar29.reflection,msg,pFVar12);
      local_170.data_ = 1;
      *(undefined8 *)this = 1;
      if ((long)local_168 - 0x4979cb9e01U < 0xffffff6d0c68c3ff) {
        absl::lts_20240722::InvalidArgumentError(this,0x15,"duration out of range");
        goto LAB_002caa47;
      }
    }
    local_170.data_ = 1;
    pFVar12 = Proto2Descriptor::MustHaveField(desc,2);
    sVar22 = UnparseProto2Descriptor::GetSize(pFVar12,msg);
    if (sVar22 == 0) {
      local_148 = 0;
      *(undefined8 *)this = 1;
LAB_002ca3b8:
      local_150 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1;
      if ((anon_union_8_1_1246618d_for_StatusOrData<int>_1)local_170.data_ !=
          (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1) goto LAB_002cae1f;
      if (local_168 == (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0) {
LAB_002ca3ea:
        if (local_148 != 0) {
          uVar2 = -local_148;
          if (0 < (int)local_148) {
            uVar2 = local_148;
          }
          local_b0 = 9;
          uVar17 = uVar2 * 0x26e978d5 >> 3 | uVar2 * -0x60000000;
          local_a0 = (ulong)uVar2;
          while (uVar17 < 0x418938) {
            local_b0 = local_b0 - 3;
            iVar20 = (int)(local_a0 / 1000);
            local_a0 = local_a0 / 1000;
            uVar17 = (uint)(iVar20 * 0x26e978d5) >> 3 | iVar20 * -0x60000000;
          }
          local_f8 = "";
          if ((int)local_148 < 0 || (long)local_168 < 0) {
            local_f8 = "-";
          }
          local_100.data_._1_7_ = 0;
          local_100.data_._0_1_ = (int)local_148 < 0 || (long)local_168 < 0;
          local_d0.data_ = (long)&local_100;
          aStack_c0 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)-(long)local_168;
          if (0 < (long)local_168) {
            aStack_c0 = local_168;
          }
          local_c8.data_ =
               (long)absl::lts_20240722::str_format_internal::FormatArgImpl::
                     Dispatch<std::basic_string_view<char,std::char_traits<char>>>;
          local_b8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<long>;
          local_a8 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_long>
          ;
          local_98 = absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<unsigned_int>;
          absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                    (&local_130,"\"%s%d.%.*ds\"",0xc,&local_d0,4);
          io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                    (&writer->sink_,(char *)local_130,(size_t)aStack_128);
          goto LAB_002ca8bc;
        }
      }
      else if (local_148 != 0) {
        if (local_148 >> 0x1f != -(local_168._4_4_ >> 0x1f)) {
          pcVar24 = "nanos and seconds signs do not match";
          uVar25 = 0x24;
          goto LAB_002caa35;
        }
        goto LAB_002ca3ea;
      }
      local_130.data_ = (long)local_168;
      aStack_128 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)
                   absl::lts_20240722::str_format_internal::FormatArgImpl::Dispatch<long>;
      absl::lts_20240722::str_format_internal::FormatPack_abi_cxx11_
                (&local_d0,"\"%ds\"",5,&local_130,1);
      io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                (&writer->sink_,(char *)local_d0,local_c8.data_);
      local_120 = aStack_c0;
      aVar14 = local_d0;
      if ((anon_union_8_1_1246618d_for_StatusOrData<int>_1 *)local_d0.data_ != &aStack_c0)
      goto LAB_002ca8cf;
      goto LAB_002ca8d7;
    }
    MVar29 = Message::GetMetadata(msg);
    local_148 = Reflection::GetInt32(MVar29.reflection,msg,pFVar12);
    *(undefined8 *)this = 1;
    if (0x88ca6c00 < local_148 + 0xc4653600) goto LAB_002ca3b8;
    pcVar24 = "duration out of range";
    uVar25 = 0x15;
LAB_002caa35:
    local_150 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x1;
    absl::lts_20240722::InvalidArgumentError(this,uVar25,pcVar24);
LAB_002caa3d:
    absl::lts_20240722::internal_statusor::StatusOrData<int>::~StatusOrData
              ((StatusOrData<int> *)&local_150.status_);
LAB_002caa47:
    absl::lts_20240722::internal_statusor::StatusOrData<long>::~StatusOrData
              ((StatusOrData<long> *)&local_170);
    return (Status)extraout_RAX_01;
  case kFieldMask:
    local_d8 = Proto2Descriptor::MustHaveField(desc,1);
    sVar22 = UnparseProto2Descriptor::GetSize(local_d8,msg);
    local_d0.data_._0_1_ = 0x22;
    io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,(char *)&local_d0.data_,1);
    local_48 = sVar22;
    if (sVar22 != 0) {
      local_e8 = &writer->scratch_buf_;
      bVar7 = true;
      sVar22 = 0;
      local_e0 = msg;
      local_50 = this;
      do {
        paVar5 = local_50;
        pMVar4 = local_e0;
        if (!bVar7) {
          io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,",",1);
        }
        MVar29 = Message::GetMetadata(pMVar4);
        psVar13 = Reflection::GetRepeatedStringReference
                            (MVar29.reflection,pMVar4,local_d8,(int)sVar22,local_e8);
        aVar23 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)(psVar13->_M_dataplus)._M_p;
        aVar14 = (anon_union_8_2_a3c22f61_for_StatusOrData<long>_3)psVar13->_M_string_length;
        local_d0.data_ = 1;
        *(undefined8 *)paVar5 = 1;
        local_c8 = aVar14;
        aStack_c0 = aVar23;
        if ((anon_union_8_1_1246618d_for_StatusOrData<int>_1)aVar14.data_ !=
            (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0) {
          aVar28 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)0x0;
          bVar7 = false;
          do {
            bVar1 = *(byte *)((long)aVar23 + (long)aVar28);
            if ((byte)(bVar1 + 0x9f) < 0x1a) {
              if (bVar7) {
                local_130.data_._0_1_ =
                     *(undefined1 *)
                      ((long)&absl::lts_20240722::ascii_internal::kToUpper + (ulong)bVar1);
                io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                          (&writer->sink_,(char *)&local_130.data_,1);
              }
              else {
LAB_002ca03c:
                local_130.data_._0_1_ = bVar1;
                io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                          (&writer->sink_,(char *)&local_130.data_,1);
              }
LAB_002ca09d:
              bVar6 = false;
            }
            else {
              if (bVar1 == 0x2e || (byte)(bVar1 - 0x30) < 10) goto LAB_002ca03c;
              if (bVar1 != 0x5f) {
                bVar18 = (writer->options_).allow_legacy_syntax;
LAB_002ca068:
                if ((bVar18 & 1) != 0) {
                  if (bVar7) {
                    local_130.data_._0_1_ = 0x5f;
                    io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                              (&writer->sink_,(char *)&local_130.data_,1);
                  }
                  local_130.data_._0_1_ = bVar1;
                  io::zc_sink_internal::ZeroCopyStreamByteSink::Append
                            (&writer->sink_,(char *)&local_130.data_,1);
                  goto LAB_002ca09d;
                }
                absl::lts_20240722::InvalidArgumentError
                          (local_50,0x21,"unexpected character in FieldMask");
                goto LAB_002ca1a1;
              }
              bVar6 = true;
              if ((bVar7) &&
                 (bVar18 = (writer->options_).allow_legacy_syntax, (bool)bVar18 == false))
              goto LAB_002ca068;
            }
            bVar7 = bVar6;
            aVar28 = (anon_union_8_1_1246618d_for_StatusOrData<int>_1)((long)aVar28 + 1);
          } while ((anon_union_8_1_1246618d_for_StatusOrData<int>_1)aVar14.data_ != aVar28);
        }
        absl::lts_20240722::internal_statusor::
        StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_>::~StatusOrData
                  ((StatusOrData<std::basic_string_view<char,_std::char_traits<char>_>_> *)&local_d0
                  );
        sVar22 = sVar22 + 1;
        bVar7 = false;
        this = local_50;
      } while (sVar22 != local_48);
    }
    pcVar24 = (char *)&local_d0;
    local_d0.data_._0_1_ = 0x22;
    sVar22 = 1;
  }
  io::zc_sink_internal::ZeroCopyStreamByteSink::Append(&writer->sink_,pcVar24,sVar22);
  uVar15 = extraout_RAX;
LAB_002ca283:
  *(undefined8 *)this = 1;
  return (Status)uVar15;
}

Assistant:

absl::Status WriteMessage(JsonWriter& writer, const Msg<Traits>& msg,
                          const Desc<Traits>& desc, bool is_top_level) {
  switch (ClassifyMessage(Traits::TypeName(desc))) {
    case MessageType::kAny:
      return WriteAny<Traits>(writer, msg, desc);
    case MessageType::kWrapper: {
      auto field = Traits::MustHaveField(desc, 1);
      if (Traits::GetSize(field, msg) == 0) {
        return WriteSingular<Traits>(writer, field);
      }
      return WriteSingular<Traits>(writer, field, msg);
    }
    case MessageType::kValue:
      return WriteValue<Traits>(writer, msg, desc, is_top_level);
    case MessageType::kStruct:
      return WriteStructValue<Traits>(writer, msg, desc);
    case MessageType::kList:
      return WriteListValue<Traits>(writer, msg, desc);
    case MessageType::kTimestamp:
      return WriteTimestamp<Traits>(writer, msg, desc);
    case MessageType::kDuration:
      return WriteDuration<Traits>(writer, msg, desc);
    case MessageType::kFieldMask:
      return WriteFieldMask<Traits>(writer, msg, desc);
    default: {
      writer.Write("{");
      writer.Push();
      bool first = true;
      RETURN_IF_ERROR(WriteFields<Traits>(writer, msg, desc, first));
      writer.Pop();
      if (!first) {
        writer.NewLine();
      }
      writer.Write("}");
      return absl::OkStatus();
    }
  }
}